

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O2

void __thiscall OpenMD::NPA::scaleSimBox(NPA *this)

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  SquareMatrix<double,_3> *pSVar3;
  uint uVar4;
  Mat3x3d scaleMat;
  Mat3x3d hmat;
  SquareMatrix<double,_3> local_f8;
  RectMatrix<double,_3U,_3U> local_b0;
  RectMatrix<double,_3U,_3U> local_68;
  
  pSVar3 = &local_f8;
  SquareMatrix<double,_3>::SquareMatrix(&local_f8);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      uVar4 = 0x3ff00000;
      if (lVar1 != lVar2) {
        uVar4 = 0;
      }
      *(ulong *)((long)pSVar3 + lVar2 * 8) = (ulong)uVar4 << 0x20;
    }
    pSVar3 = (SquareMatrix<double,_3> *)((long)pSVar3 + 0x18);
  }
  local_f8.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt *
           (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2]);
  Snapshot::getHmat((Mat3x3d *)&local_68,
                    (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  operator*((SquareMatrix3<double> *)&local_b0,(SquareMatrix3<double> *)&local_68,
            (SquareMatrix3<double> *)&local_f8);
  RectMatrix<double,_3U,_3U>::operator=(&local_68,&local_b0);
  Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,
                    (Mat3x3d *)&local_68);
  return;
}

Assistant:

void NPA::scaleSimBox() {
    Mat3x3d scaleMat;

    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        scaleMat(i, j) = 0.0;
        if (i == j) { scaleMat(i, j) = 1.0; }
      }
    }

    scaleMat(2, 2) = exp(dt * eta(2, 2));
    Mat3x3d hmat   = snap->getHmat();
    hmat           = hmat * scaleMat;
    snap->setHmat(hmat);
  }